

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkReachability(Abc_Ntk_t *pNtkRel,int nIters,int fVerbose)

{
  bool bVar1;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  abctime aVar8;
  Abc_Obj_t *pAVar9;
  Abc_Obj_t *pAVar10;
  abctime aVar11;
  abctime clk;
  int fMoreEffort;
  int fSynthesis;
  int fFixedPoint;
  int nNodesPrev;
  int nNodesNew;
  int nNodesOld;
  int nVars;
  int v;
  int i;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtkNext;
  Abc_Ntk_t *pNtkReached;
  Abc_Ntk_t *pNtkFront;
  Abc_Obj_t *pObj;
  int fVerbose_local;
  int nIters_local;
  Abc_Ntk_t *pNtkRel_local;
  
  bVar1 = false;
  pObj._0_4_ = fVerbose;
  pObj._4_4_ = nIters;
  _fVerbose_local = pNtkRel;
  iVar3 = Abc_NtkIsStrash(pNtkRel);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtkRel)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcQuant.c"
                  ,0x150,"Abc_Ntk_t *Abc_NtkReachability(Abc_Ntk_t *, int, int)");
  }
  iVar3 = Abc_NtkLatchNum(_fVerbose_local);
  if (iVar3 != 0) {
    __assert_fail("Abc_NtkLatchNum(pNtkRel) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcQuant.c"
                  ,0x151,"Abc_Ntk_t *Abc_NtkReachability(Abc_Ntk_t *, int, int)");
  }
  iVar3 = Abc_NtkPiNum(_fVerbose_local);
  if (iVar3 % 2 != 0) {
    __assert_fail("Abc_NtkPiNum(pNtkRel) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcQuant.c"
                  ,0x152,"Abc_Ntk_t *Abc_NtkReachability(Abc_Ntk_t *, int, int)");
  }
  pNtkReached = Abc_NtkInitialState(_fVerbose_local);
  pNtkNext = Abc_NtkDup(pNtkReached);
  fSynthesis = Abc_NtkNodeNum(pNtkReached);
  iVar3 = Abc_NtkPiNum(_fVerbose_local);
  iVar3 = iVar3 / 2;
  nVars = 0;
  do {
    if ((int)pObj._4_4_ <= nVars) {
LAB_003544df:
      if (!bVar1) {
        fprintf(_stdout,"Reachability analysis stopped after %d iterations.\n",(ulong)pObj._4_4_);
      }
      pAVar9 = Abc_NtkPo(pNtkNext,0);
      Abc_ObjXorFaninC(pAVar9,0);
      nVars = iVar3 * 2;
      while( true ) {
        nVars = nVars + -1;
        if (nVars < iVar3) {
          iVar3 = Abc_NtkCheck(pNtkNext);
          if (iVar3 == 0) {
            printf("Abc_NtkReachability: The network check has failed.\n");
            Abc_NtkDelete(pNtkNext);
            pNtkRel_local = (Abc_Ntk_t *)0x0;
          }
          else {
            pNtkRel_local = pNtkNext;
          }
          return pNtkRel_local;
        }
        pNtkFront = (Abc_Ntk_t *)Abc_NtkPi(pNtkNext,nVars);
        iVar7 = Abc_ObjFanoutNum((Abc_Obj_t *)pNtkFront);
        if (iVar7 != 0) break;
        Abc_NtkDeleteObj((Abc_Obj_t *)pNtkFront);
      }
      __assert_fail("Abc_ObjFanoutNum(pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcQuant.c"
                    ,0x1a0,"Abc_Ntk_t *Abc_NtkReachability(Abc_Ntk_t *, int, int)");
    }
    aVar8 = Abc_Clock();
    pNtkTemp = Abc_NtkMiterAnd(_fVerbose_local,pNtkReached,0,0);
    Abc_NtkDelete(pNtkReached);
    for (nNodesOld = 0; nNodesOld < iVar3; nNodesOld = nNodesOld + 1) {
      Abc_NtkQuantify(pNtkTemp,0,nNodesOld,(int)pObj);
      if (nNodesOld % 3 == 2) {
        Abc_NtkCleanData(pNtkTemp);
        Abc_AigCleanup((Abc_Aig_t *)pNtkTemp->pManFunc);
        Abc_NtkSynthesize(&pNtkTemp,1);
      }
    }
    Abc_NtkCleanData(pNtkTemp);
    Abc_AigCleanup((Abc_Aig_t *)pNtkTemp->pManFunc);
    Abc_NtkSynthesize(&pNtkTemp,1);
    pAVar2 = pNtkTemp;
    pNtkTemp = Abc_NtkSwapVariables(pNtkTemp);
    Abc_NtkDelete(pAVar2);
    pAVar9 = Abc_NtkPo(pNtkTemp,0);
    pAVar9 = Abc_ObjFanin0(pAVar9);
    pAVar10 = Abc_AigConst1(pNtkTemp);
    if (pAVar9 == pAVar10) {
      bVar1 = true;
      printf("Fixed point is reached!\n");
      Abc_NtkDelete(pNtkTemp);
      goto LAB_003544df;
    }
    pNtkReached = Abc_NtkMiterAnd(pNtkTemp,pNtkNext,0,1);
    Abc_NtkDelete(pNtkTemp);
    pAVar2 = pNtkNext;
    pNtkNext = Abc_NtkMiterAnd(pNtkNext,pNtkReached,1,0);
    Abc_NtkDelete(pAVar2);
    uVar4 = Abc_NtkNodeNum(pNtkReached);
    Abc_NtkSynthesize(&pNtkReached,1);
    Abc_NtkSynthesize(&pNtkNext,1);
    uVar5 = Abc_NtkNodeNum(pNtkReached);
    if ((int)pObj != 0) {
      uVar6 = Abc_NtkNodeNum(pNtkNext);
      printf("I = %3d : Reach = %6d  Fr = %6d  FrM = %6d  %7.2f %%   ",
             ((double)(int)(uVar5 - fSynthesis) * 100.0) / (double)fSynthesis,(ulong)(nVars + 1),
             (ulong)uVar6,(ulong)uVar4,(ulong)uVar5);
      Abc_Print(1,"%s =","T");
      aVar11 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar11 - aVar8) * 1.0) / 1000000.0);
    }
    fSynthesis = Abc_NtkNodeNum(pNtkReached);
    nVars = nVars + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkReachability( Abc_Ntk_t * pNtkRel, int nIters, int fVerbose )
{
    Abc_Obj_t * pObj;
    Abc_Ntk_t * pNtkFront, * pNtkReached, * pNtkNext, * pNtkTemp;
    int i, v, nVars, nNodesOld, nNodesNew, nNodesPrev;
    int fFixedPoint = 0;
    int fSynthesis  = 1;
    int fMoreEffort = 1;
    abctime clk;

    assert( Abc_NtkIsStrash(pNtkRel) );
    assert( Abc_NtkLatchNum(pNtkRel) == 0 );
    assert( Abc_NtkPiNum(pNtkRel) % 2 == 0 );

    // compute the network composed of the initial states
    pNtkFront = Abc_NtkInitialState( pNtkRel );
    pNtkReached = Abc_NtkDup( pNtkFront );
//Abc_NtkShow( pNtkReached, 0, 0, 0 );

//    if ( fVerbose )
//        printf( "Transition relation = %6d.\n", Abc_NtkNodeNum(pNtkRel) );

    // perform iterations of reachability analysis
    nNodesPrev = Abc_NtkNodeNum(pNtkFront);
    nVars = Abc_NtkPiNum(pNtkRel)/2;
    for ( i = 0; i < nIters; i++ )
    {
        clk = Abc_Clock();
        // get the set of next states
        pNtkNext = Abc_NtkMiterAnd( pNtkRel, pNtkFront, 0, 0 );
        Abc_NtkDelete( pNtkFront );
        // quantify the current state variables
        for ( v = 0; v < nVars; v++ )
        {
            Abc_NtkQuantify( pNtkNext, 0, v, fVerbose );
            if ( fSynthesis && (v % 3 == 2) )
            {
                Abc_NtkCleanData( pNtkNext );
                Abc_AigCleanup( (Abc_Aig_t *)pNtkNext->pManFunc );
                Abc_NtkSynthesize( &pNtkNext, fMoreEffort );
            }
        }
        Abc_NtkCleanData( pNtkNext );
        Abc_AigCleanup( (Abc_Aig_t *)pNtkNext->pManFunc );
        if ( fSynthesis )
            Abc_NtkSynthesize( &pNtkNext, 1 );
        // map the next states into the current states
        pNtkNext = Abc_NtkSwapVariables( pNtkTemp = pNtkNext );
        Abc_NtkDelete( pNtkTemp );
        // check the termination condition
        if ( Abc_ObjFanin0(Abc_NtkPo(pNtkNext,0)) == Abc_AigConst1(pNtkNext) )
        {
            fFixedPoint = 1;
            printf( "Fixed point is reached!\n" );
            Abc_NtkDelete( pNtkNext );
            break;
        }
        // compute new front
        pNtkFront = Abc_NtkMiterAnd( pNtkNext, pNtkReached, 0, 1 );
        Abc_NtkDelete( pNtkNext );
        // add the reached states
        pNtkReached = Abc_NtkMiterAnd( pNtkTemp = pNtkReached, pNtkFront, 1, 0 );
        Abc_NtkDelete( pNtkTemp );
        // compress the size of Front
        nNodesOld = Abc_NtkNodeNum(pNtkFront);
        if ( fSynthesis )
        {
            Abc_NtkSynthesize( &pNtkFront, fMoreEffort );
            Abc_NtkSynthesize( &pNtkReached, fMoreEffort );
        }
        nNodesNew = Abc_NtkNodeNum(pNtkFront);
        // print statistics
        if ( fVerbose )
        {
            printf( "I = %3d : Reach = %6d  Fr = %6d  FrM = %6d  %7.2f %%   ", 
                i + 1, Abc_NtkNodeNum(pNtkReached), nNodesOld, nNodesNew, 100.0*(nNodesNew-nNodesPrev)/nNodesPrev );
            ABC_PRT( "T", Abc_Clock() - clk );
        }
        nNodesPrev = Abc_NtkNodeNum(pNtkFront);
    }
    if ( !fFixedPoint )
        fprintf( stdout, "Reachability analysis stopped after %d iterations.\n", nIters );

    // complement the output to represent the set of unreachable states
    Abc_ObjXorFaninC( Abc_NtkPo(pNtkReached,0), 0 );

    // remove next state variables
    for ( i = 2*nVars - 1; i >= nVars; i-- )
    {
        pObj = Abc_NtkPi( pNtkReached, i );
        assert( Abc_ObjFanoutNum(pObj) == 0 );
        Abc_NtkDeleteObj( pObj );
    }

    // check consistency of the network
    if ( !Abc_NtkCheck( pNtkReached ) )
    {
        printf( "Abc_NtkReachability: The network check has failed.\n" );
        Abc_NtkDelete( pNtkReached );
        return NULL;
    }
    return pNtkReached;
}